

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O1

SubcaseBasePtr
deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::ImageLoadStoreNonLayeredBindingTest>(void)

{
  Context *pCVar1;
  SubcaseBase *this;
  Functions *pFVar2;
  glActiveShaderProgramFunc p_Var3;
  Functions *pFVar4;
  ulong uVar5;
  SharedPtrStateBase *extraout_RDX;
  SubcaseBase *in_RDI;
  _Map_pointer __n;
  Functions *pFVar6;
  bool bVar7;
  SubcaseBasePtr SVar8;
  
  this = (SubcaseBase *)operator_new(0x90);
  SubcaseBase::SubcaseBase(this);
  (this->super_GLWrapper)._vptr_GLWrapper =
       (_func_int **)&PTR__ImageLoadStoreNonLayeredBindingTest_02120398;
  this[1].super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)&this[1].super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  this[1].super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  this[1].super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  this[1].super_GLWrapper.m_context = (Context *)0x0;
  this[2].super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  this[2].super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  this[2].super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)&this[2].super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  this[2].super_GLWrapper.m_context = (Context *)0x0;
  this[3].super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  this[1].super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x8;
  pFVar2 = (Functions *)operator_new(0x40);
  this[1].super_GLWrapper.super_CallLogWrapper.m_gl = pFVar2;
  uVar5 = (long)this[1].super_GLWrapper.super_CallLogWrapper.m_log * 4 - 4U & 0xfffffffffffffff8;
  pFVar4 = (Functions *)((long)&pFVar2->activeShaderProgram + uVar5);
  pFVar6 = pFVar4;
  if (pFVar4 < (Functions *)((long)&pFVar2->activeTexture + uVar5)) {
    do {
      p_Var3 = (glActiveShaderProgramFunc)operator_new(0x1f8);
      pFVar6->activeShaderProgram = p_Var3;
      bVar7 = pFVar6 < pFVar4;
      pFVar6 = (Functions *)&pFVar6->activeTexture;
    } while (bVar7);
  }
  this[2].super_GLWrapper.super_CallLogWrapper.m_gl = pFVar4;
  pCVar1 = (Context *)pFVar4->activeShaderProgram;
  this[1].super_GLWrapper.m_context = pCVar1;
  this[2].super_GLWrapper._vptr_GLWrapper = (_func_int **)&pCVar1[0xf].m_contextType;
  this[3].super_GLWrapper._vptr_GLWrapper = (_func_int **)pFVar4;
  *(Context **)&this[2].super_GLWrapper.super_CallLogWrapper.m_enableLog = pCVar1;
  this[2].super_GLWrapper.m_context = (Context *)&pCVar1[0xf].m_contextType;
  *(Context **)&this[1].super_GLWrapper.super_CallLogWrapper.m_enableLog = pCVar1;
  this[2].super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)pCVar1;
  this[3].super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  *(undefined4 *)&this[3].super_GLWrapper.super_CallLogWrapper.m_log = 0;
  (in_RDI->super_GLWrapper)._vptr_GLWrapper = (_func_int **)0x0;
  (in_RDI->super_GLWrapper).super_CallLogWrapper.m_gl = (Functions *)0x0;
  (in_RDI->super_GLWrapper)._vptr_GLWrapper = (_func_int **)this;
  pFVar4 = (Functions *)operator_new(0x20);
  *(undefined4 *)&pFVar4->activeTexture = 0;
  *(undefined4 *)((long)&pFVar4->activeTexture + 4) = 0;
  pFVar4->activeShaderProgram = (glActiveShaderProgramFunc)&PTR__SharedPtrState_0210e0d0;
  pFVar4->attachShader = (glAttachShaderFunc)this;
  (in_RDI->super_GLWrapper).super_CallLogWrapper.m_gl = pFVar4;
  *(undefined4 *)&pFVar4->activeTexture = 1;
  *(undefined4 *)((long)&pFVar4->activeTexture + 4) = 1;
  SVar8.m_state = extraout_RDX;
  SVar8.m_ptr = in_RDI;
  return SVar8;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}